

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

void duckdb_re2::CoalesceWalker::DoCoalesce(Regexp **r1ptr,Regexp **r2ptr)

{
  RegexpOp RVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ParseFlags flags;
  Regexp *this;
  ostream *poVar5;
  void *pvVar6;
  Regexp **ppRVar7;
  Rune *pRVar8;
  Regexp *pRVar9;
  LogMessage *this_00;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int n;
  Rune r;
  Regexp *nre;
  Regexp *r2;
  Regexp *r1;
  ParseFlags in_stack_fffffffffffffc48;
  RegexpOp in_stack_fffffffffffffc4c;
  LogMessage *in_stack_fffffffffffffc50;
  LogMessage *in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc74;
  int in_stack_fffffffffffffc78;
  ParseFlags in_stack_fffffffffffffc7c;
  Regexp *in_stack_fffffffffffffc80;
  Regexp *in_stack_fffffffffffffc98;
  LogMessage local_340;
  int local_1bc;
  Rune local_1b8;
  LogMessage local_1a8;
  Regexp *local_28;
  Regexp *local_20;
  Regexp *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_18 = (Regexp *)*in_RDI;
  local_20 = (Regexp *)*in_RSI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Regexp::sub(local_18);
  this = Regexp::Incref(in_stack_fffffffffffffc98);
  Regexp::parse_flags(local_18);
  local_28 = Regexp::Repeat(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
                            in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
  RVar1 = Regexp::op(local_18);
  switch(RVar1) {
  case kRegexpStar:
    (local_28->arguments).repeat.min_ = 0;
    (local_28->arguments).repeat.max_ = -1;
    break;
  case kRegexpPlus:
    (local_28->arguments).repeat.min_ = 1;
    (local_28->arguments).repeat.max_ = -1;
    break;
  case kRegexpQuest:
    (local_28->arguments).repeat.min_ = 0;
    (local_28->arguments).repeat.max_ = 1;
    break;
  case kRegexpRepeat:
    iVar2 = Regexp::min(local_18);
    (local_28->arguments).repeat.min_ = iVar2;
    iVar2 = Regexp::max(local_18);
    (local_28->arguments).repeat.max_ = iVar2;
    break;
  default:
    Regexp::Decref(this);
    LogMessage::LogMessage
              (in_stack_fffffffffffffc50,
               (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),0);
    poVar5 = LogMessage::stream(&local_1a8);
    poVar5 = std::operator<<(poVar5,"DoCoalesce failed: r1->op() is ");
    RVar1 = Regexp::op(local_18);
    std::ostream::operator<<(poVar5,RVar1);
    LogMessage::~LogMessage(in_stack_fffffffffffffc60);
    return;
  }
  RVar1 = Regexp::op(local_20);
  switch(RVar1) {
  case kRegexpLiteral:
  case kRegexpAnyChar:
  case kRegexpAnyByte:
  case kRegexpCharClass:
    (local_28->arguments).repeat.min_ = (local_28->arguments).repeat.min_ + 1;
    iVar2 = Regexp::max(local_28);
    if (iVar2 != -1) {
      (local_28->arguments).repeat.max_ = (local_28->arguments).repeat.max_ + 1;
    }
    break;
  case kRegexpLiteralString:
    ppRVar7 = Regexp::sub(local_18);
    local_1b8 = Regexp::rune(*ppRVar7);
    local_1bc = 1;
    while( true ) {
      iVar2 = local_1bc;
      iVar3 = Regexp::nrunes(local_20);
      in_stack_fffffffffffffc7c = in_stack_fffffffffffffc7c & 0xffffff;
      if (iVar2 < iVar3) {
        pRVar8 = Regexp::runes(local_20);
        in_stack_fffffffffffffc7c =
             CONCAT13(pRVar8[local_1bc] == local_1b8,(int3)in_stack_fffffffffffffc7c);
      }
      if ((char)(in_stack_fffffffffffffc7c >> 0x18) == '\0') break;
      local_1bc = local_1bc + 1;
    }
    (local_28->arguments).repeat.min_ = local_1bc + (local_28->arguments).repeat.min_;
    iVar3 = Regexp::max(local_28);
    if (iVar3 != -1) {
      (local_28->arguments).repeat.max_ = local_1bc + (local_28->arguments).repeat.max_;
    }
    iVar3 = local_1bc;
    iVar4 = Regexp::nrunes(local_20);
    if (iVar3 != iVar4) {
      *local_8 = local_28;
      Regexp::runes(local_20);
      iVar4 = Regexp::nrunes(local_20);
      flags = iVar4 - local_1bc;
      Regexp::parse_flags(local_20);
      pRVar9 = Regexp::LiteralString((Rune *)CONCAT44(in_stack_fffffffffffffc7c,iVar2),iVar3,flags);
      *local_10 = pRVar9;
      goto LAB_026450c0;
    }
    break;
  default:
    Regexp::Decref(this);
    LogMessage::LogMessage
              (in_stack_fffffffffffffc50,
               (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),0);
    this_00 = (LogMessage *)LogMessage::stream(&local_340);
    poVar5 = std::operator<<((ostream *)this_00,"DoCoalesce failed: r2->op() is ");
    RVar1 = Regexp::op(local_20);
    std::ostream::operator<<(poVar5,RVar1);
    LogMessage::~LogMessage(this_00);
    return;
  case kRegexpStar:
    (local_28->arguments).repeat.max_ = -1;
    break;
  case kRegexpPlus:
    (local_28->arguments).repeat.min_ = (local_28->arguments).repeat.min_ + 1;
    (local_28->arguments).repeat.max_ = -1;
    break;
  case kRegexpQuest:
    iVar2 = Regexp::max(local_28);
    if (iVar2 != -1) {
      (local_28->arguments).repeat.max_ = (local_28->arguments).repeat.max_ + 1;
    }
    break;
  case kRegexpRepeat:
    iVar2 = Regexp::min(local_20);
    (local_28->arguments).repeat.min_ = iVar2 + (local_28->arguments).repeat.min_;
    iVar2 = Regexp::max(local_20);
    if (iVar2 == -1) {
      (local_28->arguments).repeat.max_ = -1;
    }
    else {
      iVar2 = Regexp::max(local_28);
      if (iVar2 != -1) {
        iVar2 = Regexp::max(local_20);
        (local_28->arguments).repeat.max_ = iVar2 + (local_28->arguments).repeat.max_;
      }
    }
  }
  pvVar6 = operator_new(0x28);
  Regexp::Regexp((Regexp *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                 in_stack_fffffffffffffc48);
  *local_8 = pvVar6;
  *local_10 = local_28;
LAB_026450c0:
  Regexp::Decref(this);
  Regexp::Decref(this);
  return;
}

Assistant:

void CoalesceWalker::DoCoalesce(Regexp** r1ptr, Regexp** r2ptr) {
  Regexp* r1 = *r1ptr;
  Regexp* r2 = *r2ptr;

  Regexp* nre = Regexp::Repeat(
      r1->sub()[0]->Incref(), r1->parse_flags(), 0, 0);

  switch (r1->op()) {
    case kRegexpStar:
      nre->arguments.repeat.min_ = 0;
      nre->arguments.repeat.max_ = -1;
      break;

    case kRegexpPlus:
      nre->arguments.repeat.min_ = 1;
      nre->arguments.repeat.max_ = -1;
      break;

    case kRegexpQuest:
      nre->arguments.repeat.min_ = 0;
      nre->arguments.repeat.max_ = 1;
      break;

    case kRegexpRepeat:
      nre->arguments.repeat.min_ = r1->min();
      nre->arguments.repeat.max_ = r1->max();
      break;

    default:
      nre->Decref();
      LOG(DFATAL) << "DoCoalesce failed: r1->op() is " << r1->op();
      return;
  }

  switch (r2->op()) {
    case kRegexpStar:
      nre->arguments.repeat.max_ = -1;
      goto LeaveEmpty;

    case kRegexpPlus:
      nre->arguments.repeat.min_++;
      nre->arguments.repeat.max_ = -1;
      goto LeaveEmpty;

    case kRegexpQuest:
      if (nre->max() != -1)
        nre->arguments.repeat.max_++;
      goto LeaveEmpty;

    case kRegexpRepeat:
      nre->arguments.repeat.min_ += r2->min();
      if (r2->max() == -1)
        nre->arguments.repeat.max_ = -1;
      else if (nre->max() != -1)
        nre->arguments.repeat.max_ += r2->max();
      goto LeaveEmpty;

    case kRegexpLiteral:
    case kRegexpCharClass:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
      nre->arguments.repeat.min_++;
      if (nre->max() != -1)
        nre->arguments.repeat.max_++;
      goto LeaveEmpty;

    LeaveEmpty:
      *r1ptr = new Regexp(kRegexpEmptyMatch, Regexp::NoParseFlags);
      *r2ptr = nre;
      break;

    case kRegexpLiteralString: {
      Rune r = r1->sub()[0]->rune();
      // Determine how much of the literal string is removed.
      // We know that we have at least one rune. :)
      int n = 1;
      while (n < r2->nrunes() && r2->runes()[n] == r)
        n++;
      nre->arguments.repeat.min_ += n;
      if (nre->max() != -1)
        nre->arguments.repeat.max_ += n;
      if (n == r2->nrunes())
        goto LeaveEmpty;
      *r1ptr = nre;
      *r2ptr = Regexp::LiteralString(
          &r2->runes()[n], r2->nrunes() - n, r2->parse_flags());
      break;
    }

    default:
      nre->Decref();
      LOG(DFATAL) << "DoCoalesce failed: r2->op() is " << r2->op();
      return;
  }

  r1->Decref();
  r2->Decref();
}